

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobject.c
# Opt level: O3

void fiobj_free_complex_object(FIOBJ o)

{
  undefined1 uVar1;
  fiobj_object_vtable_s *pfVar2;
  long local_58;
  long lStack_50;
  undefined8 local_48;
  void *pvStack_40;
  
  local_48 = 0;
  pvStack_40 = (void *)0x0;
  local_58 = 0;
  lStack_50 = 0;
  do {
    pfVar2 = &FIOBJECT_VTABLE_NUMBER;
    if ((o & 1) == 0) {
      switch((uint)o & 6) {
      case 0:
        uVar1 = *(undefined1 *)(o & 0xfffffffffffffff8);
        break;
      case 2:
        goto switchD_00145c1c_caseD_2;
      case 4:
        goto switchD_00145c1c_caseD_4;
      case 6:
        uVar1 = (undefined1)o;
      }
      pfVar2 = &FIOBJECT_VTABLE_NUMBER;
      switch(uVar1) {
      case 0x27:
        pfVar2 = &FIOBJECT_VTABLE_FLOAT;
        break;
      case 0x28:
switchD_00145c1c_caseD_2:
        pfVar2 = &FIOBJECT_VTABLE_STRING;
        break;
      case 0x29:
        pfVar2 = &FIOBJECT_VTABLE_ARRAY;
        break;
      case 0x2a:
switchD_00145c1c_caseD_4:
        pfVar2 = &FIOBJECT_VTABLE_HASH;
        break;
      case 0x2b:
        pfVar2 = &FIOBJECT_VTABLE_DATA;
      }
    }
    (*pfVar2->dealloc)(o,fiobj_dealloc_task,&local_58);
    if (lStack_50 == local_58) {
      fio_free(pvStack_40);
      return;
    }
    o = *(ulong *)((long)pvStack_40 + lStack_50 * 8 + -8);
    lStack_50 = lStack_50 + -1;
  } while( true );
}

Assistant:

void fiobj_free_complex_object(FIOBJ o) {
  fiobj_stack_s stack = FIO_ARY_INIT;
  do {
    FIOBJECT2VTBL(o)->dealloc(o, fiobj_dealloc_task, &stack);
  } while (!fiobj_stack_pop(&stack, &o));
  fiobj_stack_free(&stack);
}